

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

void SHA256D64(uchar *out,uchar *in,size_t blocks)

{
  long lVar1;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ulong local_20;
  long local_18;
  long local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((anonymous_namespace)::TransformD64_8way != (code *)0x0) {
    for (; 7 < local_20; local_20 = local_20 - 8) {
      (*(anonymous_namespace)::TransformD64_8way)(local_10,local_18);
      local_10 = local_10 + 0x100;
      local_18 = local_18 + 0x200;
    }
  }
  if ((anonymous_namespace)::TransformD64_4way != (code *)0x0) {
    for (; 3 < local_20; local_20 = local_20 - 4) {
      (*(anonymous_namespace)::TransformD64_4way)(local_10,local_18);
      local_10 = local_10 + 0x80;
      local_18 = local_18 + 0x100;
    }
  }
  if ((anonymous_namespace)::TransformD64_2way != (code *)0x0) {
    for (; 1 < local_20; local_20 = local_20 - 2) {
      (*(anonymous_namespace)::TransformD64_2way)(local_10,local_18);
      local_10 = local_10 + 0x40;
      local_18 = local_18 + 0x80;
    }
  }
  for (; local_20 != 0; local_20 = local_20 - 1) {
    (*(code *)(anonymous_namespace)::TransformD64)(local_10,local_18);
    local_10 = local_10 + 0x20;
    local_18 = local_18 + 0x40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SHA256D64(unsigned char* out, const unsigned char* in, size_t blocks)
{
    if (TransformD64_8way) {
        while (blocks >= 8) {
            TransformD64_8way(out, in);
            out += 256;
            in += 512;
            blocks -= 8;
        }
    }
    if (TransformD64_4way) {
        while (blocks >= 4) {
            TransformD64_4way(out, in);
            out += 128;
            in += 256;
            blocks -= 4;
        }
    }
    if (TransformD64_2way) {
        while (blocks >= 2) {
            TransformD64_2way(out, in);
            out += 64;
            in += 128;
            blocks -= 2;
        }
    }
    while (blocks) {
        TransformD64(out, in);
        out += 32;
        in += 64;
        --blocks;
    }
}